

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFetc.cpp
# Opt level: O0

int __thiscall
NaPNFetcher::verify(NaPNFetcher *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
                   size_t tbslen)

{
  uint uVar1;
  ulong extraout_RAX;
  ulong uVar2;
  NaVector *pNVar3;
  ulong extraout_RAX_00;
  uint iMaxPos;
  int i;
  uint uVar4;
  int iVar5;
  undefined1 local_1;
  
  if (this->nOutDim < 0) {
    NaPrintLog("VERIFY FAILED: output dimension is not set!\n");
    local_1 = 0;
    uVar2 = extraout_RAX;
  }
  else {
    uVar2 = 0;
    if (this->pfSumWeights == (NaReal *)0x0) {
      uVar4 = 0;
      for (iVar5 = 0; iVar5 < this->nOutDim; iVar5 = iVar5 + 1) {
        if (uVar4 < this->piOutMap[iVar5]) {
          uVar4 = this->piOutMap[iVar5];
        }
      }
      pNVar3 = NaPetriCnInput::data((NaPetriCnInput *)CONCAT44(iVar5,uVar4));
      uVar1 = (*pNVar3->_vptr_NaVector[6])();
      uVar2 = (ulong)uVar4;
      if (uVar1 <= uVar4) {
        NaPrintLog("VERIFY FAILED: some output positions are out of input range!\n");
        local_1 = 0;
        uVar2 = extraout_RAX_00;
        goto LAB_0014d7ef;
      }
    }
    local_1 = 1;
  }
LAB_0014d7ef:
  return (int)CONCAT71((int7)(uVar2 >> 8),local_1);
}

Assistant:

bool
NaPNFetcher::verify ()
{
  if(nOutDim < 0){
    NaPrintLog("VERIFY FAILED: output dimension is not set!\n");
    return false;
  }

  if(NULL == pfSumWeights)
    {
      int	i;
      unsigned	iMaxPos = 0;
      for(i = 0; i < nOutDim; ++i){
	if(iMaxPos < piOutMap[i])
	  iMaxPos = piOutMap[i];
      }

      if((unsigned)iMaxPos >= in.data().dim()){
	NaPrintLog("VERIFY FAILED: some output positions are out "\
		   "of input range!\n");
	return false;
      }
    }

  return true;
}